

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoise.c
# Opt level: O3

void compute_band_corr(float *bandE,kiss_fft_cpx *X,kiss_fft_cpx *P)

{
  int iVar1;
  ulong uVar2;
  float *pfVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float afStack_68 [2];
  float sum [22];
  
  sum[0xe] = 0.0;
  sum[0xf] = 0.0;
  sum[0x10] = 0.0;
  sum[0x11] = 0.0;
  sum[10] = 0.0;
  sum[0xb] = 0.0;
  sum[0xc] = 0.0;
  sum[0xd] = 0.0;
  sum[6] = 0.0;
  sum[7] = 0.0;
  sum[8] = 0.0;
  sum[9] = 0.0;
  sum[2] = 0.0;
  sum[3] = 0.0;
  sum[4] = 0.0;
  sum[5] = 0.0;
  afStack_68[0] = 0.0;
  afStack_68[1] = 0.0;
  sum[0] = 0.0;
  sum[1] = 0.0;
  sum[0x12] = 0.0;
  sum[0x13] = 0.0;
  iVar1 = 0;
  lVar4 = 0;
  do {
    iVar6 = (int)(short)iVar1;
    iVar1 = (int)eband5ms[lVar4 + 1];
    if (iVar1 - iVar6 != 0 && iVar6 <= iVar1) {
      uVar5 = (iVar1 - iVar6) * 4;
      uVar8 = *(undefined8 *)(sum + lVar4 + -2);
      lVar7 = (long)(iVar6 << 2);
      uVar2 = 0;
      do {
        fVar9 = (float)(int)uVar2 / (float)(int)uVar5;
        fVar10 = X[lVar7 + uVar2].i * P[lVar7 + uVar2].i + X[lVar7 + uVar2].r * P[lVar7 + uVar2].r;
        uVar8 = CONCAT44((float)((ulong)uVar8 >> 0x20) + fVar10 * fVar9,
                         (float)uVar8 + fVar10 * (1.0 - fVar9));
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
      *(undefined8 *)(sum + lVar4 + -2) = uVar8;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x15);
  afStack_68[0] = afStack_68[0] + afStack_68[0];
  sum[0x13] = sum[0x13] + sum[0x13];
  pfVar3 = afStack_68;
  for (lVar4 = 0x16; lVar4 != 0; lVar4 = lVar4 + -1) {
    *bandE = *pfVar3;
    pfVar3 = pfVar3 + 1;
    bandE = bandE + 1;
  }
  return;
}

Assistant:

void compute_band_corr(float *bandE, const kiss_fft_cpx *X, const kiss_fft_cpx *P) {
    int i;
    float sum[NB_BANDS] = {0};
    for (i = 0; i < NB_BANDS - 1; i++) {
        int j;
        int band_size;
        band_size = (eband5ms[i + 1] - eband5ms[i]) << FRAME_SIZE_SHIFT;
        for (j = 0; j < band_size; j++) {
            float tmp;
            float frac = (float) j / band_size;
            tmp = X[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].r * P[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].r;
            tmp += X[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].i * P[(eband5ms[i] << FRAME_SIZE_SHIFT) + j].i;
            sum[i] += (1 - frac) * tmp;
            sum[i + 1] += frac * tmp;
        }
    }
    sum[0] *= 2;
    sum[NB_BANDS - 1] *= 2;
    for (i = 0; i < NB_BANDS; i++) {
        bandE[i] = sum[i];
    }
}